

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTextureImplFBO.cpp
# Opt level: O1

bool __thiscall sf::priv::RenderTextureImplFBO::activate(RenderTextureImplFBO *this,bool active)

{
  bool bVar1;
  ulong uVar2;
  Context *this_00;
  _Base_ptr p_Var3;
  ostream *poVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  undefined7 in_register_00000031;
  Lock lock;
  Lock LStack_18;
  
  if ((int)CONCAT71(in_register_00000031,active) == 0) {
    (*sf_glad_glBindFramebufferEXT)(0x8d40,0);
  }
  else {
    uVar2 = Context::getActiveContextId();
    if (uVar2 == 0) {
      if (this->m_context == (Context *)0x0) {
        this_00 = (Context *)operator_new(8);
        Context::Context(this_00);
        this->m_context = this_00;
      }
      Context::setActive(this->m_context,true);
      uVar2 = Context::getActiveContextId();
      if (uVar2 == 0) {
        poVar4 = err();
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,"Impossible to activate render texture (failed to create backup context)",
                   0x47);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        return false;
      }
    }
    Lock::Lock(&LStack_18,(Mutex *)&(anonymous_namespace)::mutex);
    if (this->m_multisample == true) {
      p_Var3 = &(this->m_multisampleFrameBuffers)._M_t._M_impl.super__Rb_tree_header._M_header;
      p_Var5 = p_Var3;
      for (p_Var6 = (this->m_multisampleFrameBuffers)._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_parent; p_Var6 != (_Base_ptr)0x0;
          p_Var6 = (&p_Var6->_M_left)[*(ulong *)(p_Var6 + 1) < uVar2]) {
        if (*(ulong *)(p_Var6 + 1) >= uVar2) {
          p_Var5 = p_Var6;
        }
      }
    }
    else {
      p_Var3 = &(this->m_frameBuffers)._M_t._M_impl.super__Rb_tree_header._M_header;
      p_Var5 = p_Var3;
      for (p_Var6 = (this->m_frameBuffers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[*(ulong *)(p_Var6 + 1) < uVar2]) {
        if (*(ulong *)(p_Var6 + 1) >= uVar2) {
          p_Var5 = p_Var6;
        }
      }
    }
    p_Var6 = p_Var3;
    if ((p_Var5 != p_Var3) && (p_Var6 = p_Var5, uVar2 < *(ulong *)(p_Var5 + 1))) {
      p_Var6 = p_Var3;
    }
    if (p_Var6 == p_Var3) {
      Lock::~Lock(&LStack_18);
      bVar1 = createFrameBuffer(this);
      return bVar1;
    }
    (*sf_glad_glBindFramebufferEXT)(0x8d40,*(GLuint *)&p_Var6[1]._M_parent);
    Lock::~Lock(&LStack_18);
  }
  return true;
}

Assistant:

bool RenderTextureImplFBO::activate(bool active)
{
    // Unbind the FBO if requested
    if (!active)
    {
        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_FRAMEBUFFER, 0));
        return true;
    }

    Uint64 contextId = Context::getActiveContextId();

    // In the odd case we have to activate and there is no active
    // context yet, we have to create one
    if (!contextId)
    {
        if (!m_context)
            m_context = new Context;

        m_context->setActive(true);

        contextId = Context::getActiveContextId();

        if (!contextId)
        {
            err() << "Impossible to activate render texture (failed to create backup context)" << std::endl;

            return false;
        }
    }

    // Lookup the FBO corresponding to the currently active context
    // If none is found, there is no FBO corresponding to the
    // currently active context so we will have to create a new FBO
    {
        Lock lock(mutex);

        std::map<Uint64, unsigned int>::iterator iter;
        
        if (m_multisample)
        {
            iter = m_multisampleFrameBuffers.find(contextId);

            if (iter != m_multisampleFrameBuffers.end())
            {
                glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_FRAMEBUFFER, iter->second));

                return true;
            }
        }
        else
        {
            iter = m_frameBuffers.find(contextId);

            if (iter != m_frameBuffers.end())
            {
                glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_FRAMEBUFFER, iter->second));

                return true;
            }
        }
    }

    return createFrameBuffer();
}